

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMakeSubDirRegistering.cpp
# Opt level: O0

void __thiscall
proj2cmake::cmake::CMakeSubDirRegistering::operator()(CMakeSubDirRegistering *this,path *subDir)

{
  bool bVar1;
  ostream *poVar2;
  string *Input;
  path local_38;
  path *local_18;
  path *subDir_local;
  CMakeSubDirRegistering *this_local;
  
  local_18 = subDir;
  subDir_local = (path *)this;
  poVar2 = std::operator<<(this->mOs,"add_subdirectory(");
  boost::filesystem::operator<<(poVar2,local_18);
  Input = boost::filesystem::path::string_abi_cxx11_(local_18);
  bVar1 = boost::algorithm::contains<std::__cxx11::string,char[3]>(Input,(char (*) [3])"..");
  if (bVar1) {
    poVar2 = std::operator<<(this->mOs," ");
    boost::filesystem::path::filename();
    boost::filesystem::operator<<(poVar2,&local_38);
    boost::filesystem::path::~path(&local_38);
  }
  poVar2 = std::operator<<(this->mOs,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void cmake::CMakeSubDirRegistering::operator()(const boost::filesystem::path& subDir)
{
   mOs << "add_subdirectory(" << subDir;

   if (boost::contains(subDir.string(), ".."))
   {
      mOs << " " << subDir.filename();
   }

   mOs << ")" << std::endl;
}